

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

int stscanf(tchar_t *In,tchar_t *Mask,...)

{
  byte *pbVar1;
  byte bVar2;
  double dVar3;
  double dVar4;
  char in_AL;
  int iVar5;
  size_t sVar6;
  int iVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  undefined8 in_R8;
  long lVar13;
  byte bVar14;
  uint uVar15;
  undefined8 in_R9;
  void **ppvVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  long lVar22;
  byte *pbVar23;
  bool bVar24;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list Arg;
  void **local_110;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined4 local_98;
  undefined4 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Da;
    local_88 = in_XMM3_Da;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar6 = strlen(In);
  local_110 = &Arg[0].overflow_arg_area;
  uVar18 = 0x10;
  if (In == (tchar_t *)0x0 || sVar6 == 0) {
    return 0;
  }
  lVar8 = 0;
  iVar5 = 0;
LAB_00109711:
  bVar14 = *Mask;
  if (0x1f < bVar14) {
    if (bVar14 != 0x25) {
      if (bVar14 == 0x20) goto LAB_0010973c;
LAB_0010987f:
      if (bVar14 != *In) {
        return iVar5;
      }
      In = (tchar_t *)((byte *)In + 1);
      sVar6 = sVar6 - 1;
      goto LAB_00109c9b;
    }
    bVar14 = ((byte *)Mask)[1];
    uVar10 = (uint)bVar14;
    Mask = (tchar_t *)((byte *)Mask + 1);
    uVar12 = 0xffffffff;
    if (0xfffffff5 < (int)(char)bVar14 - 0x3aU) {
      uVar15 = (int)(char)bVar14 - 0x30;
      uVar12 = 0;
      do {
        uVar12 = uVar15 + uVar12 * 10;
        uVar10 = (uint)(char)((byte *)Mask)[1];
        Mask = (tchar_t *)((byte *)Mask + 1);
        uVar15 = uVar10 - 0x30;
      } while (uVar15 < 10);
    }
    while ((char)uVar10 == 'l') {
      lVar8 = lVar8 + 1;
      pbVar1 = (byte *)Mask + 1;
      Mask = (tchar_t *)((byte *)Mask + 1);
      uVar10 = (uint)*pbVar1;
    }
    uVar10 = uVar10 & 0xff;
    if (uVar10 < 0x69) {
      if (uVar10 == 0x58) {
LAB_001098ad:
        pbVar1 = (byte *)In + sVar6;
        do {
          bVar14 = *In;
          pbVar23 = (byte *)In;
          if ((0x20 < (ulong)bVar14) || ((0x100002600U >> ((ulong)bVar14 & 0x3f) & 1) == 0))
          goto LAB_001098d1;
          In = (tchar_t *)((byte *)In + 1);
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
        bVar14 = *pbVar1;
        sVar6 = 0;
        pbVar23 = pbVar1;
LAB_001098d1:
        uVar19 = (ulong)(bVar14 == 0x2d);
        In = (tchar_t *)(pbVar23 + uVar19);
        sVar6 = sVar6 - uVar19;
        iVar17 = 0;
        if ((sVar6 != 0) && (uVar10 = (uint)(bVar14 == 0x2d), iVar17 = 0, uVar12 != uVar10)) {
          iVar11 = uVar12 - uVar10;
          iVar17 = 0;
          sVar21 = sVar6;
          while( true ) {
            iVar11 = iVar11 + -1;
            iVar7 = (int)*In;
            sVar6 = sVar21;
            if (*In == 0) break;
            uVar12 = iVar7 - 0x30;
            if (uVar12 < 10) {
LAB_00109927:
              iVar17 = iVar17 * 0x10 + uVar12;
            }
            else {
              if (iVar7 - 0x61U < 6) {
                uVar12 = iVar7 - 0x57;
                goto LAB_00109927;
              }
              if (5 < iVar7 - 0x41U) break;
              iVar17 = iVar17 * 0x10 + iVar7 + -0x37;
            }
            In = (tchar_t *)((byte *)In + 1);
            sVar6 = sVar21 - 1;
            if ((sVar21 == 1) || (sVar21 = sVar6, iVar11 == 0)) break;
          }
        }
LAB_00109a85:
        if ((byte *)In == pbVar23) {
          return iVar5;
        }
        iVar11 = -iVar17;
        if (bVar14 != 0x2d) {
          iVar11 = iVar17;
        }
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar16 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar16 = local_110;
          local_110 = local_110 + 1;
        }
        *(int *)*ppvVar16 = iVar11;
        goto LAB_00109c99;
      }
      if (uVar10 == 100) goto LAB_0010996d;
      if (uVar10 != 0x66) goto LAB_00109c9b;
      pbVar1 = (byte *)In + sVar6;
      do {
        bVar14 = *In;
        pbVar23 = (byte *)In;
        if ((0x20 < (ulong)bVar14) || ((0x100002600U >> ((ulong)bVar14 & 0x3f) & 1) == 0))
        goto LAB_001097fa;
        In = (tchar_t *)((byte *)In + 1);
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
      bVar14 = *pbVar1;
      sVar6 = 0;
      pbVar23 = pbVar1;
LAB_001097fa:
      uVar19 = (ulong)(bVar14 == 0x2d);
      pbVar1 = pbVar23 + uVar19;
      lVar20 = sVar6 - uVar19;
      if (lVar20 == 0) {
        lVar9 = 0;
        In = (tchar_t *)pbVar1;
      }
      else {
        lVar22 = 0;
        lVar9 = 0;
        do {
          bVar2 = pbVar1[lVar22];
          if ((int)(char)bVar2 - 0x3aU < 0xfffffff6) {
            lVar13 = -lVar9;
            if (bVar14 != 0x2d) {
              lVar13 = lVar9;
            }
            if (uVar19 + lVar22 == 0) {
              return iVar5;
            }
            if (bVar2 != 0x2e) {
              In = (tchar_t *)(pbVar1 + lVar22);
              sVar6 = lVar20 - lVar22;
              goto LAB_00109b60;
            }
            In = (tchar_t *)(pbVar1 + lVar22 + 1);
            sVar6 = (sVar6 + -uVar19 + -1) - lVar22;
            if (sVar6 == 0) goto LAB_00109b5e;
            dVar4 = 1.0;
            lVar9 = 0;
            goto LAB_00109c12;
          }
          lVar9 = (long)(int)(char)bVar2 + lVar9 * 10 + -0x30;
          lVar22 = lVar22 + 1;
          In = (tchar_t *)(pbVar23 + lVar20 + uVar19);
        } while (lVar22 != sVar6 + -uVar19);
      }
      lVar13 = -lVar9;
      if (bVar14 != 0x2d) {
        lVar13 = lVar9;
      }
      if ((byte *)In == pbVar23) {
        return iVar5;
      }
LAB_00109b5e:
      sVar6 = 0;
LAB_00109b60:
      dVar3 = 0.0;
      dVar4 = 1.0;
      goto LAB_00109b64;
    }
    if (uVar10 != 0x69) {
      if (uVar10 != 0x6f) {
        if (uVar10 != 0x78) goto LAB_00109c9b;
        goto LAB_001098ad;
      }
      pbVar1 = (byte *)In + sVar6;
      do {
        bVar14 = *In;
        pbVar23 = (byte *)In;
        if ((0x20 < (ulong)bVar14) || ((0x100002600U >> ((ulong)bVar14 & 0x3f) & 1) == 0))
        goto LAB_00109a26;
        In = (tchar_t *)((byte *)In + 1);
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
      bVar14 = *pbVar1;
      sVar6 = 0;
      pbVar23 = pbVar1;
LAB_00109a26:
      In = (tchar_t *)(pbVar23 + (bVar14 == 0x2d));
      sVar6 = sVar6 - (bVar14 == 0x2d);
      iVar17 = 0;
      if ((sVar6 != 0) && (iVar17 = 0, uVar12 != 0)) {
        iVar17 = 0;
        while( true ) {
          uVar12 = uVar12 - 1;
          if ((*In & 0xf8U) != 0x30) break;
          iVar17 = (uint)(byte)(*In - 0x30) + iVar17 * 8;
          In = (tchar_t *)((byte *)In + 1);
          sVar21 = sVar6 - 1;
          bVar24 = sVar6 == 1;
          sVar6 = sVar21;
          if ((bVar24) || (uVar12 == 0)) break;
        }
      }
      goto LAB_00109a85;
    }
LAB_0010996d:
    pbVar1 = (byte *)In + sVar6;
    do {
      bVar14 = *In;
      pbVar23 = (byte *)In;
      if ((0x20 < (ulong)bVar14) || ((0x100002600U >> ((ulong)bVar14 & 0x3f) & 1) == 0))
      goto LAB_00109991;
      In = (tchar_t *)((byte *)In + 1);
      sVar6 = sVar6 - 1;
    } while (sVar6 != 0);
    bVar14 = *pbVar1;
    sVar6 = 0;
    pbVar23 = pbVar1;
LAB_00109991:
    In = (tchar_t *)(pbVar23 + (bVar14 == 0x2d));
    sVar6 = sVar6 - (bVar14 == 0x2d);
    if ((sVar6 == 0) || (uVar12 == 0)) {
      lVar20 = 0;
    }
    else {
      lVar20 = 0;
      sVar21 = sVar6;
      while( true ) {
        uVar12 = uVar12 - 1;
        sVar6 = sVar21;
        if ((int)*In - 0x3aU < 0xfffffff6) break;
        lVar20 = (long)(int)*In + lVar20 * 10 + -0x30;
        In = (tchar_t *)((byte *)In + 1);
        sVar6 = sVar21 - 1;
        if ((sVar21 == 1) || (sVar21 = sVar6, uVar12 == 0)) break;
      }
    }
    lVar9 = -lVar20;
    if (bVar14 != 0x2d) {
      lVar9 = lVar20;
    }
    if ((byte *)In == pbVar23) {
      return iVar5;
    }
    if (lVar8 == 0) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar16 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar16 = local_110;
        local_110 = local_110 + 1;
      }
      *(int *)*ppvVar16 = (int)lVar9;
    }
    else {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar16 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar16 = local_110;
        local_110 = local_110 + 1;
      }
      *(long *)*ppvVar16 = lVar9;
    }
    goto LAB_00109c99;
  }
  if (bVar14 != 9) {
    if (bVar14 == 0) {
      return iVar5;
    }
    goto LAB_0010987f;
  }
LAB_0010973c:
  while (((ulong)(byte)*In < 0x21 && ((0x100002600U >> ((ulong)(byte)*In & 0x3f) & 1) != 0))) {
    In = (tchar_t *)((byte *)In + 1);
    sVar6 = sVar6 - 1;
    if (sVar6 == 0) {
      return iVar5;
    }
  }
  goto LAB_00109c9b;
  while( true ) {
    lVar9 = (long)(int)*In + lVar9 * 10 + -0x30;
    dVar4 = dVar4 / 10.0;
    In = (tchar_t *)((byte *)In + 1);
    sVar6 = sVar6 - 1;
    if (sVar6 == 0) break;
LAB_00109c12:
    if ((int)*In - 0x3aU < 0xfffffff6) goto LAB_00109c42;
  }
  sVar6 = 0;
  In = (tchar_t *)(pbVar23 + lVar20 + uVar19);
LAB_00109c42:
  dVar3 = (double)lVar9;
LAB_00109b64:
  if (lVar8 == 0) {
    uVar19 = (ulong)uVar18;
    if (uVar19 < 0x29) {
      uVar18 = uVar18 + 8;
      ppvVar16 = (void **)((long)local_e8 + uVar19);
    }
    else {
      ppvVar16 = local_110;
      local_110 = local_110 + 1;
    }
    *(float *)*ppvVar16 = (float)(dVar3 * dVar4) + (float)lVar13;
  }
  else {
    uVar19 = (ulong)uVar18;
    if (uVar19 < 0x29) {
      uVar18 = uVar18 + 8;
      ppvVar16 = (void **)((long)local_e8 + uVar19);
    }
    else {
      ppvVar16 = local_110;
      local_110 = local_110 + 1;
    }
    *(double *)*ppvVar16 = dVar3 * dVar4 + (double)lVar13;
  }
LAB_00109c99:
  iVar5 = iVar5 + 1;
LAB_00109c9b:
  if (sVar6 == 0) {
    return iVar5;
  }
  Mask = (tchar_t *)((byte *)Mask + 1);
  if ((byte *)In == (byte *)0x0) {
    return iVar5;
  }
  goto LAB_00109711;
}

Assistant:

int stscanf(const tchar_t* In, const tchar_t* Mask, ...)
{
    int n;
    size_t InLen = tcslen(In);
	va_list Arg;
	va_start(Arg, Mask);
    n = var_stscanf_s(In,&InLen,Mask,Arg);
	va_end(Arg);
    return n;
}